

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
          (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *__return_storage_ptr__,
          PrimVar *var)

{
  double t;
  undefined8 uVar1;
  bool bVar2;
  value_type *pvVar3;
  pointer pSVar4;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar5;
  pointer pSVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  optional<tinyusdz::value::normal3f> local_88;
  optional<tinyusdz::value::normal3f> pv;
  Animatable<tinyusdz::value::normal3f> dst;
  
  dst._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  dst._ts._17_8_ = 0;
  dst._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dst._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  dst._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  dst._value._0_6_ = 0;
  dst._value.y._2_2_ = 0;
  dst._value.z = 0.0;
  dst._has_value = false;
  dst._blocked = false;
  bVar2 = primvar::PrimVar::is_valid(var);
  if (bVar2) {
    bVar2 = primvar::PrimVar::has_value(var);
    if (bVar2) {
      primvar::PrimVar::get_value<tinyusdz::value::normal3f>(&local_88,var);
      pv.has_value_ = local_88.has_value_;
      if (local_88.has_value_ != true) goto LAB_001e13fa;
      pv.contained._8_4_ = local_88.contained._8_4_;
      pv.contained._0_8_ = local_88.contained._0_8_;
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::normal3f>::value(&pv);
      uVar1._0_4_ = pvVar3->x;
      uVar1._4_4_ = pvVar3->y;
      dst._value._0_6_ = SUB86(uVar1,0);
      dst._value.y._2_2_ = (undefined2)((uint)uVar1._4_4_ >> 0x10);
      dst._value.z = pvVar3->z;
      dst._has_value = true;
      dst._blocked = false;
      pSVar6 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar4 != pSVar6) goto LAB_001e1410;
    }
    else {
LAB_001e13fa:
      pSVar6 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar4 == pSVar6) goto LAB_001e14c8;
LAB_001e1410:
      lVar8 = 0;
      for (uVar7 = 0; uVar7 < (ulong)(((long)pSVar4 - (long)pSVar6) / 0x28); uVar7 = uVar7 + 1) {
        pvVar5 = tinyusdz::value::TimeSamples::get_samples(&var->_ts);
        pSVar6 = (pvVar5->
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((&pSVar6->blocked)[lVar8] == true) {
          TypedTimeSamples<tinyusdz::value::normal3f>::add_blocked_sample
                    (&dst._ts,*(double *)((long)&pSVar6->t + lVar8));
        }
        else {
          tinyusdz::value::Value::get_value<tinyusdz::value::normal3f>
                    (&local_88,(Value *)((long)&(pSVar6->value).v_.storage + lVar8),false);
          pv.has_value_ = local_88.has_value_;
          if (local_88.has_value_ != true) goto LAB_001e14c8;
          pv.contained._8_4_ = local_88.contained._8_4_;
          pv.contained._0_8_ = local_88.contained._0_8_;
          t = *(double *)((long)&pSVar6->t + lVar8);
          pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::normal3f>::value(&pv);
          TypedTimeSamples<tinyusdz::value::normal3f>::add_sample(&dst._ts,t,pvVar3);
        }
        pSVar6 = (var->_ts)._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar4 = (var->_ts)._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar8 = lVar8 + 0x28;
      }
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
    optional<tinyusdz::Animatable<tinyusdz::value::normal3f>,_0>(__return_storage_ptr__,&dst);
  }
  else {
LAB_001e14c8:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  }
  ::std::
  _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                   *)&dst._ts);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}